

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap64::Cleanup(HeapBlockMap64 *this,bool concurrentFindImplicitRoot)

{
  HeapBlockMap32 *this_00;
  Node *pNVar1;
  Node *buffer;
  Node **ppNVar2;
  HeapAllocator *this_01;
  
  pNVar1 = this->list;
  while (ppNVar2 = &this->list, buffer = pNVar1, buffer != (Node *)0x0) {
    this_00 = &buffer->map;
    HeapBlockMap32::Cleanup(this_00,false);
    pNVar1 = buffer->next;
    this = (HeapBlockMap64 *)&buffer->next;
    if ((!concurrentFindImplicitRoot) && (this_00->count == 0)) {
      *ppNVar2 = pNVar1;
      this_01 = HeapAllocator::GetNoMemProtectInstance();
      HeapBlockMap32::~HeapBlockMap32(this_00);
      HeapAllocator::Free(this_01,buffer,0x8028);
      this = (HeapBlockMap64 *)ppNVar2;
    }
  }
  return;
}

Assistant:

void
HeapBlockMap64::Cleanup(bool concurrentFindImplicitRoot)
{
    Node ** prevnext = &this->list;
    Node * node = *prevnext;
    while (node != nullptr)
    {
        node->map.Cleanup(concurrentFindImplicitRoot);
        Node * nextNode = node->next;
        if (!concurrentFindImplicitRoot && node->map.Empty())
        {
            // Concurrent traversals of the node list would result in a race and possible UAF.
            // Currently we simply defer node free for the lifetime of the heap (only affects MemProtect).
            *prevnext = node->next;
            NoMemProtectHeapDelete(node);
        }
        else
        {
            prevnext = &node->next;
        }
        node = nextNode;
    }
}